

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::OutputFile::initialize(OutputFile *this,Header *header)

{
  int iVar1;
  pointer ppLVar2;
  int iVar3;
  bool bVar4;
  Format FVar5;
  int iVar6;
  Box2i *pBVar7;
  LineOrder *pLVar8;
  size_t maxScanLineSize;
  LineBuffer *pLVar9;
  Compression *pCVar10;
  Compressor *pCVar11;
  Data *pDVar12;
  size_t i;
  ulong uVar13;
  
  Header::operator=(&this->_data->header,header);
  bVar4 = Header::hasType(&this->_data->header);
  if (bVar4) {
    Header::setType(&this->_data->header,(string *)SCANLINEIMAGE_abi_cxx11_);
  }
  pBVar7 = Header::dataWindow(header);
  pLVar8 = Header::lineOrder(header);
  iVar6 = (pBVar7->min).y;
  iVar1 = (pBVar7->max).y;
  iVar3 = iVar1;
  if (*pLVar8 == INCREASING_Y) {
    iVar3 = iVar6;
  }
  pDVar12 = this->_data;
  pDVar12->currentScanLine = iVar3;
  pDVar12->missingScanLines = (iVar1 - iVar6) + 1;
  pLVar8 = Header::lineOrder(header);
  pDVar12 = this->_data;
  pDVar12->lineOrder = *pLVar8;
  iVar6 = (pBVar7->min).y;
  iVar1 = (pBVar7->max).x;
  iVar3 = (pBVar7->max).y;
  pDVar12->minX = (pBVar7->min).x;
  pDVar12->maxX = iVar1;
  pDVar12->minY = iVar6;
  pDVar12->maxY = iVar3;
  maxScanLineSize = bytesPerLineTable(&pDVar12->header,&pDVar12->bytesPerLine);
  uVar13 = 0;
  while( true ) {
    pDVar12 = this->_data;
    ppLVar2 = (pDVar12->lineBuffers).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pDVar12->lineBuffers).
                      super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar2 >> 3) <= uVar13)
    break;
    pLVar9 = (LineBuffer *)operator_new(0x90);
    pCVar10 = Header::compression(&pDVar12->header);
    pCVar11 = newCompressor(*pCVar10,maxScanLineSize,&this->_data->header);
    *(undefined1 (*) [16])((long)&(pLVar9->buffer)._data + 4) = (undefined1  [16])0x0;
    (pLVar9->buffer)._size = 0;
    (pLVar9->buffer)._data = (char *)0x0;
    pLVar9->compressor = pCVar11;
    pLVar9->partiallyFull = false;
    pLVar9->hasException = false;
    (pLVar9->exception)._M_dataplus._M_p = (pointer)&(pLVar9->exception).field_2;
    (pLVar9->exception)._M_string_length = 0;
    (pLVar9->exception).field_2._M_local_buf[0] = '\0';
    IlmThread_2_5::Semaphore::Semaphore(&pLVar9->_sem,1);
    (this->_data->lineBuffers).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar13] = pLVar9;
    uVar13 = uVar13 + 1;
  }
  pLVar9 = *ppLVar2;
  FVar5 = defaultFormat(pLVar9->compressor);
  this->_data->format = FVar5;
  iVar6 = numLinesInBuffer(pLVar9->compressor);
  pDVar12 = this->_data;
  pDVar12->linesInBuffer = iVar6;
  pDVar12->lineBufferSize = maxScanLineSize * (long)iVar6;
  for (uVar13 = 0;
      ppLVar2 = (pDVar12->lineBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar13 < (ulong)((long)(pDVar12->lineBuffers).
                             super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar2 >> 3);
      uVar13 = uVar13 + 1) {
    Array<char>::resizeErase(&ppLVar2[uVar13]->buffer,pDVar12->lineBufferSize);
    pDVar12 = this->_data;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&pDVar12->lineOffsets,
             (long)((((pBVar7->max).y - (pBVar7->min).y) + pDVar12->linesInBuffer) /
                   pDVar12->linesInBuffer));
  pDVar12 = this->_data;
  offsetInLineBufferTable
            (&pDVar12->bytesPerLine,pDVar12->linesInBuffer,&pDVar12->offsetInLineBuffer);
  return;
}

Assistant:

void
OutputFile::initialize (const Header &header)
{
    _data->header = header;

    // "fix" the type if it happens to be set incorrectly
    // (attribute is optional, but ensure it is correct if it exists)
    if(_data->header.hasType())
    {
        _data->header.setType(SCANLINEIMAGE);
    }
    
    const Box2i &dataWindow = header.dataWindow();

    _data->currentScanLine = (header.lineOrder() == INCREASING_Y)?
				 dataWindow.min.y: dataWindow.max.y;

    _data->missingScanLines = dataWindow.max.y - dataWindow.min.y + 1;
    _data->lineOrder = header.lineOrder();
    _data->minX = dataWindow.min.x;
    _data->maxX = dataWindow.max.x;
    _data->minY = dataWindow.min.y;
    _data->maxY = dataWindow.max.y;

    size_t maxBytesPerLine = bytesPerLineTable (_data->header,
						_data->bytesPerLine);

    for (size_t i = 0; i < _data->lineBuffers.size(); ++i)
    {
        _data->lineBuffers[i] =
	    new LineBuffer (newCompressor (_data->header.compression(),
					   maxBytesPerLine,
					   _data->header));
    }

    LineBuffer *lineBuffer = _data->lineBuffers[0];
    _data->format = defaultFormat (lineBuffer->compressor);
    _data->linesInBuffer = numLinesInBuffer (lineBuffer->compressor);
    _data->lineBufferSize = maxBytesPerLine * _data->linesInBuffer;

    for (size_t i = 0; i < _data->lineBuffers.size(); i++)
        _data->lineBuffers[i]->buffer.resizeErase(_data->lineBufferSize);

    int lineOffsetSize = (dataWindow.max.y - dataWindow.min.y +
			  _data->linesInBuffer) / _data->linesInBuffer;

    _data->lineOffsets.resize (lineOffsetSize);
    
    
    offsetInLineBufferTable (_data->bytesPerLine,
			     _data->linesInBuffer,
			     _data->offsetInLineBuffer);
}